

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O1

void hralg(double *x,int N,int p,int q,double *phi,double *theta,double *var)

{
  int iVar1;
  uint rows;
  long lVar2;
  double *x_00;
  long lVar3;
  double *phi_00;
  void *__s;
  double *sig;
  double *col;
  double *C;
  double *C_00;
  double *x_01;
  int *ipiv;
  ulong uVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  
  uVar16 = (ulong)(uint)p;
  lVar2 = (long)N;
  x_00 = (double *)malloc(lVar2 * 8);
  iVar1 = q;
  if (q < p) {
    iVar1 = p;
  }
  if ((9 < iVar1) || (uVar9 = 10, N <= q + p + 0x14)) {
    uVar9 = (ulong)(iVar1 + 1);
  }
  iVar1 = q + p;
  iVar8 = (int)uVar9;
  lVar3 = (long)iVar8;
  phi_00 = (double *)malloc(lVar3 * 8);
  __s = malloc(lVar2 * 8);
  iVar5 = iVar8 + q;
  rows = N - iVar5;
  lVar11 = (long)iVar1;
  sVar15 = (int)rows * lVar11 * 8;
  sig = (double *)malloc(sVar15);
  col = (double *)malloc(sVar15);
  sVar15 = lVar11 * 8;
  C = (double *)malloc(sVar15 * lVar11);
  C_00 = (double *)malloc(sVar15);
  x_01 = (double *)malloc(sVar15);
  ipiv = (int *)malloc(lVar11 << 2);
  dVar17 = mean(x,N);
  if (0 < N) {
    uVar4 = 0;
    do {
      x_00[uVar4] = x[uVar4] - dVar17;
      uVar4 = uVar4 + 1;
    } while ((uint)N != uVar4);
  }
  ywalg(x_00,N,iVar8,phi_00);
  if (0 < N) {
    memset(__s,0,(ulong)(uint)N << 3);
  }
  if (iVar8 < N) {
    lVar6 = (lVar3 << 0x20) + -0x100000000;
    lVar10 = lVar3;
    do {
      *(double *)((long)__s + lVar10 * 8) = x_00[lVar10];
      if (0 < iVar8) {
        dVar17 = *(double *)((long)__s + lVar10 * 8);
        uVar4 = 0;
        lVar12 = lVar6;
        do {
          dVar17 = dVar17 - phi_00[uVar4] * *(double *)((long)x_00 + (lVar12 >> 0x1d));
          uVar4 = uVar4 + 1;
          lVar12 = lVar12 + -0x100000000;
        } while (uVar9 != uVar4);
        *(double *)((long)__s + lVar10 * 8) = dVar17;
      }
      lVar10 = lVar10 + 1;
      lVar6 = lVar6 + 0x100000000;
    } while (lVar10 != lVar2);
  }
  if (0 < (int)rows) {
    pdVar7 = sig + p;
    iVar8 = iVar8 + q + -1;
    uVar9 = 0;
    pdVar13 = sig;
    do {
      if (0 < p) {
        uVar4 = 0;
        iVar14 = iVar8;
        do {
          pdVar13[uVar4] = x_00[iVar14];
          uVar4 = uVar4 + 1;
          iVar14 = iVar14 + -1;
        } while (uVar16 != uVar4);
      }
      if (0 < q) {
        uVar4 = 0;
        iVar14 = iVar8;
        do {
          pdVar7[uVar4] = -*(double *)((long)__s + (long)iVar14 * 8);
          uVar4 = uVar4 + 1;
          iVar14 = iVar14 + -1;
        } while ((uint)q != uVar4);
      }
      uVar9 = uVar9 + 1;
      pdVar13 = pdVar13 + lVar11;
      iVar8 = iVar8 + 1;
      pdVar7 = pdVar7 + lVar11;
    } while (uVar9 != rows);
  }
  mtranspose(sig,rows,iVar1,col);
  mmult(col,sig,C,iVar1,rows,iVar1);
  mmult(col,x_00 + lVar3 + q,C_00,iVar1,rows,1);
  ludecomp(C,iVar1,ipiv);
  linsolve(C,iVar1,C_00,ipiv,x_01);
  if (0 < p) {
    memcpy(phi,x_01,uVar16 * 8);
  }
  if (0 < q) {
    iVar8 = p + 1;
    if (p + 1 < iVar1) {
      iVar8 = iVar1;
    }
    memcpy(theta,x_01 + p,(ulong)(uint)(~p + iVar8) * 8 + 8);
  }
  dVar17 = 0.0;
  if (iVar5 < N) {
    lVar3 = (long)iVar5;
    lVar11 = (lVar3 << 0x20) + -0x100000000;
    do {
      dVar18 = x_00[lVar3];
      if (0 < p) {
        uVar9 = 0;
        lVar10 = lVar11;
        do {
          dVar18 = dVar18 - phi[uVar9] * *(double *)((long)x_00 + (lVar10 >> 0x1d));
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + -0x100000000;
        } while (uVar16 != uVar9);
      }
      if (0 < q) {
        uVar9 = 0;
        lVar10 = lVar11;
        do {
          dVar18 = dVar18 + theta[uVar9] * *(double *)((long)__s + (lVar10 >> 0x1d));
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + -0x100000000;
        } while ((uint)q != uVar9);
      }
      dVar17 = dVar17 + dVar18 * dVar18;
      lVar3 = lVar3 + 1;
      lVar11 = lVar11 + 0x100000000;
    } while (lVar3 < lVar2);
  }
  *var = dVar17 / (double)(int)rows;
  free(x_00);
  free(phi_00);
  free(__s);
  free(sig);
  free(col);
  free(C);
  free(C_00);
  free(ipiv);
  free(x_01);
  return;
}

Assistant:

void hralg(double *x, int N, int p,int q, double *phi,double *theta, double *var) {
	int m,i,t,pq,j,k;
	double wmean,sos;
	double *inp,*phim,*a,*z,*zt,*A,*b,*temp;
	int *ipiv;

	inp = (double*)malloc(sizeof(double)* N);

	if (p > q) {
		m = p;
	}
	else {
		m = q;
	}

	if (m < 10  && N > p+q+20) {
		m = 10;
	}
	else {
		m = m + 1;
	}

	pq = p + q;

	phim = (double*)malloc(sizeof(double)* m);
	a = (double*)malloc(sizeof(double)* N);
	z = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	zt = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	A = (double*)malloc(sizeof(double)* pq * pq);
	b = (double*)malloc(sizeof(double)* pq);
	temp = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	wmean = mean(x, N);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	// Estimate AR(m) coefficients

	ywalg(inp, N, m, phim);

	for (i = 0; i < N; ++i) {
		a[i] = 0.0;
	}

	for (t = m; t < N; ++t) {
		a[t] = inp[t];
		for (i = 0; i < m; ++i) {
			a[t] -= phim[i] * inp[t - i - 1];
		}
	}

	for (i = 0; i < N - m - q; ++i) {
		t = i * pq;
		for (j = 0; j < p; ++j) {
			z[t + j] = inp[m + q + i - j - 1];
		}

		for (k = 0; k < q; ++k) {
			z[t + p + k] = -a[m + q + i - k - 1];
		}
	}

	mtranspose(z, N - m - q, pq, zt);
	mmult(zt, z, A, pq, N - m - q, pq);
	mmult(zt, inp + m + q, b, pq, N - m - q, 1);


	ludecomp(A, pq, ipiv);
	linsolve(A, pq, b, ipiv, temp);

	for (i = 0; i < p; ++i) {
		phi[i] = temp[i];
	}

	for (i = p; i < pq; ++i) {
		theta[i-p] = temp[i];
	}
	sos = 0.0;
	for (t = m+q; t < N; ++t) {
		wmean = inp[t];
		for (i = 0; i < p; ++i) {
			wmean -= (phi[i] * inp[t - i - 1]);
		}

		for (i = 0; i < q; ++i) {
			wmean += (theta[i] * a[t - i - 1]);
		}

		sos += (wmean*wmean);
	}

	*var = sos / (N - m - q);

	free(inp);
	free(phim);
	free(a);
	free(z);
	free(zt);
	free(A);
	free(b);
	free(ipiv);
	free(temp);
}